

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O2

void __thiscall
gss::innards::HomomorphismModel::_build_distance3_graphs
          (HomomorphismModel *this,
          vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *graph_rows,
          uint size,uint *idx,bool pattern)

{
  pointer pSVar1;
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var2;
  uint uVar3;
  SVOBitset *other;
  SVOBitset *this_00;
  uint uVar4;
  value_type nv;
  value_type nc;
  SVOBitset local_140;
  SVOBitset local_b8;
  
  for (uVar4 = 0; uVar4 != size; uVar4 = uVar4 + 1) {
    SVOBitset::SVOBitset
              (&local_140,
               (graph_rows->
               super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
               )._M_impl.super__Vector_impl_data._M_start + this->max_graphs * uVar4);
    SVOBitset::operator|=
              ((graph_rows->
               super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
               )._M_impl.super__Vector_impl_data._M_start + (this->max_graphs * uVar4 + *idx),
               &local_140);
    while( true ) {
      uVar3 = SVOBitset::find_first(&local_140);
      if (uVar3 == 0xffffffff) break;
      SVOBitset::reset(&local_140,uVar3);
      SVOBitset::SVOBitset
                (&local_b8,
                 (graph_rows->
                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                 )._M_impl.super__Vector_impl_data._M_start + uVar3 * this->max_graphs);
      this_00 = (graph_rows->
                super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                )._M_impl.super__Vector_impl_data._M_start + (this->max_graphs * uVar4 + *idx);
      other = &local_b8;
      while( true ) {
        SVOBitset::operator|=(this_00,other);
        uVar3 = SVOBitset::find_first(&local_b8);
        if (uVar3 == 0xffffffff) break;
        SVOBitset::reset(&local_b8,uVar3);
        pSVar1 = (graph_rows->
                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        other = pSVar1 + uVar3 * this->max_graphs;
        this_00 = pSVar1 + (this->max_graphs * uVar4 + *idx);
      }
      SVOBitset::~SVOBitset(&local_b8);
    }
    SVOBitset::~SVOBitset(&local_140);
  }
  if (pattern) {
    _Var2._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,"distance3",(allocator<char> *)&local_b8);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(_Var2._M_head_impl)->supplemental_graph_names,(value_type *)&local_140);
    std::__cxx11::string::~string((string *)&local_140);
  }
  *idx = *idx + 1;
  return;
}

Assistant:

auto HomomorphismModel::_build_distance3_graphs(vector<SVOBitset> & graph_rows, unsigned size, unsigned & idx,
        bool pattern) -> void
{
    for (unsigned v = 0; v < size; ++v) {
        auto nv = graph_rows[v * max_graphs + 0];
        graph_rows[v * max_graphs + idx] |= nv;
        for (auto c = nv.find_first(); c != decltype(nv)::npos; c = nv.find_first()) {
            nv.reset(c);
            auto nc = graph_rows[c * max_graphs + 0];
            graph_rows[v * max_graphs + idx] |= nc;
            for (auto w = nc.find_first(); w != decltype(nc)::npos; w = nc.find_first()) {
                nc.reset(w);
                // v--c--w so v is within distance 3 of w's neighbours
                graph_rows[v * max_graphs + idx] |= graph_rows[w * max_graphs + 0];
            }
        }
    }

    if (pattern)
        _imp->supplemental_graph_names.push_back("distance3");
    ++idx;
}